

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linalg.cc
# Opt level: O1

Matrix33d * gmath::createRy(Matrix33d *__return_storage_ptr__,double a)

{
  double dVar1;
  undefined1 auVar2 [16];
  long lVar3;
  undefined1 auVar4 [16];
  long lVar5;
  
  __return_storage_ptr__->v[2][0] = 0.0;
  __return_storage_ptr__->v[2][1] = 0.0;
  __return_storage_ptr__->v[1][1] = 0.0;
  __return_storage_ptr__->v[1][2] = 0.0;
  __return_storage_ptr__->v[0][2] = 0.0;
  __return_storage_ptr__->v[1][0] = 0.0;
  __return_storage_ptr__->v[0][0] = 0.0;
  __return_storage_ptr__->v[0][1] = 0.0;
  __return_storage_ptr__->v[2][2] = 0.0;
  auVar2 = _DAT_00121080;
  lVar3 = 0;
  auVar4 = _DAT_00121070;
  do {
    if (SUB164(auVar4 ^ auVar2,4) == -0x80000000 && SUB164(auVar4 ^ auVar2,0) < -0x7ffffffd) {
      *(undefined8 *)((long)__return_storage_ptr__->v[0] + lVar3) = 0x3ff0000000000000;
      *(undefined8 *)((long)__return_storage_ptr__->v[1] + lVar3 + 8) = 0x3ff0000000000000;
    }
    lVar5 = auVar4._8_8_;
    auVar4._0_8_ = auVar4._0_8_ + 2;
    auVar4._8_8_ = lVar5 + 2;
    lVar3 = lVar3 + 0x40;
  } while (lVar3 != 0x80);
  dVar1 = cos(a);
  __return_storage_ptr__->v[0][0] = dVar1;
  __return_storage_ptr__->v[0][1] = 0.0;
  dVar1 = sin(a);
  __return_storage_ptr__->v[0][2] = dVar1;
  *(undefined4 *)__return_storage_ptr__->v[1] = 0;
  *(undefined4 *)((long)__return_storage_ptr__->v[1] + 4) = 0;
  *(undefined4 *)(__return_storage_ptr__->v[1] + 1) = 0;
  *(undefined4 *)((long)__return_storage_ptr__->v[1] + 0xc) = 0x3ff00000;
  __return_storage_ptr__->v[1][2] = 0.0;
  dVar1 = sin(a);
  __return_storage_ptr__->v[2][0] = -dVar1;
  __return_storage_ptr__->v[2][1] = 0.0;
  dVar1 = cos(a);
  __return_storage_ptr__->v[2][2] = dVar1;
  return __return_storage_ptr__;
}

Assistant:

Matrix33d createRy(double a)
{
  Matrix33d ret;

  ret(0, 0)=cos(a);
  ret(0, 1)=0.0;
  ret(0, 2)=sin(a);

  ret(1, 0)=0.0;
  ret(1, 1)=1.0;
  ret(1, 2)=0.0;

  ret(2, 0)=-sin(a);
  ret(2, 1)=0.0;
  ret(2, 2)=cos(a);

  return ret;
}